

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

int Vec_IntCheckUniqueSmall(Vec_Int_t *p)

{
  int local_20;
  int local_1c;
  int k;
  int i;
  Vec_Int_t *p_local;
  
  local_1c = 0;
  do {
    local_20 = local_1c;
    if (p->nSize <= local_1c) {
      return 1;
    }
    while (local_20 = local_20 + 1, local_20 < p->nSize) {
      if (p->pArray[local_1c] == p->pArray[local_20]) {
        return 0;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

static inline int Vec_IntCheckUniqueSmall( Vec_Int_t * p )
{
    int i, k;
    for ( i = 0; i < p->nSize; i++ )
        for ( k = i+1; k < p->nSize; k++ )
            if ( p->pArray[i] == p->pArray[k] )
                return 0;
    return 1;
}